

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

double DistanceToCapsuleAxisHelper(ON_RTreeCapsule *a_capsule,ON_RTreeBBox *a_rect)

{
  double dVar1;
  double dVar2;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar2 = a_capsule->m_domain[0];
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
LAB_005b4594:
    dVar1 = 1.0 - dVar2;
    local_38 = a_capsule->m_point[0][0] * dVar1 + a_capsule->m_point[1][0] * dVar2;
    local_30 = a_capsule->m_point[0][1] * dVar1 + a_capsule->m_point[1][1] * dVar2;
    local_28 = dVar1 * a_capsule->m_point[0][2] + dVar2 * a_capsule->m_point[1][2];
  }
  else {
    if ((a_capsule->m_domain[1] == 1.0) && (!NAN(a_capsule->m_domain[1]))) goto LAB_005b4671;
    if ((dVar2 != 0.0) || (NAN(dVar2))) goto LAB_005b4594;
    local_38 = a_capsule->m_point[0][0];
    local_30 = a_capsule->m_point[0][1];
    local_28 = a_capsule->m_point[0][2];
  }
  dVar2 = a_capsule->m_domain[1];
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar1 = 1.0 - dVar2;
    local_20 = a_capsule->m_point[0][0] * dVar1 + a_capsule->m_point[1][0] * dVar2;
    local_18 = a_capsule->m_point[0][1] * dVar1 + a_capsule->m_point[1][1] * dVar2;
    local_10 = dVar1 * a_capsule->m_point[0][2] + dVar2 * a_capsule->m_point[1][2];
    a_capsule = (ON_RTreeCapsule *)&stack0xffffffffffffffc8;
  }
  else {
    local_20 = a_capsule->m_point[1][0];
    local_18 = a_capsule->m_point[1][1];
    local_10 = a_capsule->m_point[1][2];
    a_capsule = (ON_RTreeCapsule *)&stack0xffffffffffffffc8;
  }
LAB_005b4671:
  dVar2 = ON_BoundingBox::MinimumDistanceTo((ON_BoundingBox *)a_rect,(ON_Line *)a_capsule);
  return dVar2;
}

Assistant:

static double DistanceToCapsuleAxisHelper(const struct ON_RTreeCapsule* a_capsule, const ON_RTreeBBox* a_rect)
{
  double L[2][3], s[2];
  if ( 0.0 == a_capsule->m_domain[0] && 1.0 == a_capsule->m_domain[1] )
    return ((const ON_BoundingBox*)a_rect->m_min)->MinimumDistanceTo( *((const ON_Line*)a_capsule->m_point[0]) );

  if ( 0.0 == a_capsule->m_domain[0] )
  {
    L[0][0] = a_capsule->m_point[0][0];
    L[0][1] = a_capsule->m_point[0][1];
    L[0][2] = a_capsule->m_point[0][2];
  }
  else
  {
    s[0] = 1.0 - a_capsule->m_domain[0];
    s[1] = a_capsule->m_domain[0];
    L[0][0] = s[0]*a_capsule->m_point[0][0] + s[1]*a_capsule->m_point[1][0];
    L[0][1] = s[0]*a_capsule->m_point[0][1] + s[1]*a_capsule->m_point[1][1];
    L[0][2] = s[0]*a_capsule->m_point[0][2] + s[1]*a_capsule->m_point[1][2];
  }

  if ( 0.0 == a_capsule->m_domain[1] )
  {
    L[1][0] = a_capsule->m_point[1][0];
    L[1][1] = a_capsule->m_point[1][1];
    L[1][2] = a_capsule->m_point[1][2];
  }
  else
  {
    s[0] = 1.0 - a_capsule->m_domain[1];
    s[1] = a_capsule->m_domain[1];
    L[1][0] = s[0]*a_capsule->m_point[0][0] + s[1]*a_capsule->m_point[1][0];
    L[1][1] = s[0]*a_capsule->m_point[0][1] + s[1]*a_capsule->m_point[1][1];
    L[1][2] = s[0]*a_capsule->m_point[0][2] + s[1]*a_capsule->m_point[1][2];
  }

  return ((const ON_BoundingBox*)a_rect->m_min)->MinimumDistanceTo( *((const ON_Line*)L[0]) );
}